

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

void __thiscall
Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder::fail
          (ContextResultsRecorder *this,string *given,NameStack *whenStack,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  Results *pRVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  pRVar1 = (this->results_).value;
  Util::Impl::Impl_Optional::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_38,description);
  (*pRVar1->_vptr_Results[10])
            (pRVar1,&this->contextStack_,given,whenStack,&local_38,expressionText,variableList);
  if (local_38._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38._M_head_impl);
  }
  return;
}

Assistant:

virtual void fail(const string& given,
                          const NameStack& whenStack,
                          optional<string> description,
                          const string &expressionText,
                          const vector <Variable> &variableList) {
            return results_->fail(contextStack_, given, whenStack, description, expressionText, variableList);
        }